

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::BeginWrite3dmTable(ON_BinaryArchive *this,uint typecode)

{
  bool bVar1;
  ON_3dmArchiveTableType table;
  char *sFormat;
  int line_number;
  
  if (typecode == 0) {
    sFormat = "ON_BinaryArchive::BeginWrite3dmTable() bad typecode";
    line_number = 0x2284;
  }
  else {
    table = TableTypeFromTypecode(this,typecode);
    if (table == Unset) {
      sFormat = "ON_BinaryArchive::BeginWrite3dmTable() bad typecode";
      line_number = 0x228a;
    }
    else if (this->m_3dm_active_table == Unset) {
      if ((this->m_chunk).m_count == 0) {
        bVar1 = Begin3dmTable(this,write3dm,table);
        if (!bVar1) {
          return false;
        }
        bVar1 = ArchiveContains3dmTable(this,table);
        if (!bVar1) {
          return true;
        }
        bVar1 = BeginWrite3dmBigChunk(this,typecode,0);
        if (bVar1) {
          return true;
        }
        End3dmTable(this,table,false);
        return false;
      }
      sFormat = "ON_BinaryArchive::BeginWrite3dmTable() m_chunk.Count() != 0";
      line_number = 0x2294;
    }
    else {
      sFormat = "ON_BinaryArchive::BeginWrite3dmTable() m_active_table != no_active_table";
      line_number = 0x228f;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_BinaryArchive::BeginWrite3dmTable( unsigned int typecode )
{
  if (0 == typecode)
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() bad typecode");
    return false;
  }
  const ON_3dmArchiveTableType tt = TableTypeFromTypecode(typecode);
  if (tt == ON_3dmArchiveTableType::Unset) 
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() bad typecode");
    return false;
  }
  if ( Active3dmTable() != ON_3dmArchiveTableType::Unset )
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() m_active_table != no_active_table");
    return false;
  }
  if ( 0 != m_chunk.Count() ) 
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() m_chunk.Count() != 0");
    return false;
  }
  if (false == Begin3dmTable(ON::archive_mode::write3dm,tt))
    return false;

  bool rc;
  if (ArchiveContains3dmTable(tt))
  {
    rc = BeginWrite3dmChunk(typecode, 0);
    if (false == rc)
      End3dmTable(tt, false);
  }
  else
    rc = true;

  return rc;
}